

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O1

int process_tracelog(char *fname,void *userdata)

{
  bool bVar1;
  byte bVar2;
  uint32 uVar3;
  int iVar4;
  ALfloat AVar5;
  ALfloat AVar6;
  ALfloat AVar7;
  uint32 uVar8;
  uint32 uVar9;
  uint32 uVar10;
  uint32 uVar11;
  __off_t __offset;
  __off_t total;
  __off_t _Var12;
  ALfloat *pAVar13;
  ALfloat *pAVar14;
  ALuint *pAVar15;
  ALuint *pAVar16;
  ALint *pAVar17;
  ALint *pAVar18;
  ALboolean *origvalues;
  ALboolean *values;
  ALfloat *origvalue3;
  uint8 *puVar19;
  ALCdevice *pAVar20;
  ALint *pAVar21;
  undefined4 extraout_var;
  ALCcontext *pAVar22;
  uint8 *puVar23;
  char *pcVar24;
  void *pvVar25;
  undefined4 extraout_var_00;
  ALCvoid *origbuffer;
  ALCint *pAVar26;
  ALCint *pAVar27;
  ALdouble *origvalues_00;
  ALdouble *values_00;
  ALdouble AVar28;
  uint64 uVar29;
  ALvoid *origdata;
  uint8 *puVar30;
  uint uVar31;
  ALboolean okay;
  ulong uVar32;
  uint64 len;
  int local_26c;
  ALfloat *local_268;
  CallerInfo callerinfo;
  
  io_failure = 0;
  next_mapped_threadid = 0;
  trace_scope = 0;
  guserdata = userdata;
  logfd = open(fname,0);
  if (logfd == -1) {
    process_tracelog_cold_6();
    iVar4 = 0;
  }
  else {
    fflush(_stderr);
    uVar3 = readle32();
    if (uVar3 == 0x104e5a1) {
      uVar3 = readle32();
      if (uVar3 == 1) {
        __offset = lseek(logfd,0,1);
        total = lseek(logfd,0,2);
        _Var12 = lseek(logfd,__offset,0);
        if (((_Var12 == -1) || (__offset == -1)) || (total == -1)) {
          process_tracelog_cold_3();
        }
        local_26c = 1;
        bVar1 = false;
        do {
          if ((io_failure == 0) && (__offset = lseek(logfd,0,1), __offset == -1)) {
            process_tracelog_cold_4();
            __offset = -1;
          }
          if (io_failure != 0) {
            local_26c = 0;
            break;
          }
          iVar4 = visit_progress(guserdata,__offset,total);
          if (iVar4 == 0) {
            process_tracelog_cold_5();
            local_26c = -1;
            break;
          }
          uVar3 = readle32();
          switch(uVar3) {
          case 0:
            uVar3 = readle32();
            bVar1 = true;
            if (io_failure == 0) {
              okay = '\x01';
LAB_0010d120:
              bVar1 = true;
              visit_eos(guserdata,okay,uVar3);
            }
            break;
          case 1:
            uVar3 = readle32();
            if (io_failure == 0) {
              visit_al_error_event(guserdata,uVar3);
            }
            break;
          case 2:
            pAVar20 = (ALCdevice *)readle64();
            uVar3 = readle32();
            if (io_failure == 0) {
              visit_alc_error_event(guserdata,pAVar20,uVar3);
            }
            break;
          case 3:
            uVar3 = readle32();
            if (uVar3 != 0) {
              do {
                uVar3 = uVar3 - 1;
                pvVar25 = (void *)readle64();
                puVar23 = IO_BLOB((uint64 *)&callerinfo);
                bVar2 = io_failure;
                if ((puVar23 != (uint8 *)0x0 && (io_failure & 1) == 0) &&
                   (pcVar24 = strdup((char *)puVar23),
                   pcVar24 != (char *)0x0 && pvVar25 != (void *)0x0)) {
                  add_stackframe_to_map(pvVar25,pcVar24);
                }
              } while ((bVar2 & 1) == 0 && uVar3 != 0);
            }
            break;
          default:
            bVar1 = true;
            local_26c = 0;
            if (io_failure == 0) {
              local_26c = 0;
              okay = '\0';
              uVar3 = 0;
              goto LAB_0010d120;
            }
            break;
          case 5:
            pAVar20 = (ALCdevice *)readle64();
            uVar3 = readle32();
            uVar8 = readle32();
            if (io_failure == 0) {
              visit_device_state_changed_int(guserdata,pAVar20,uVar3,uVar8);
            }
            break;
          case 6:
            pAVar22 = (ALCcontext *)readle64();
            uVar3 = readle32();
            uVar8 = readle32();
            if (io_failure == 0) {
              visit_context_state_changed_enum(guserdata,pAVar22,uVar3,uVar8);
            }
            break;
          case 7:
            pAVar22 = (ALCcontext *)readle64();
            uVar3 = readle32();
            AVar5 = (ALfloat)readle32();
            if (io_failure == 0) {
              visit_context_state_changed_float(guserdata,pAVar22,uVar3,AVar5);
            }
            break;
          case 8:
            pAVar22 = (ALCcontext *)readle64();
            uVar3 = readle32();
            puVar23 = IO_BLOB((uint64 *)&callerinfo);
            if (io_failure == 0) {
              visit_context_state_changed_string(guserdata,pAVar22,uVar3,(ALchar *)puVar23);
            }
            break;
          case 9:
            pAVar22 = (ALCcontext *)readle64();
            uVar3 = readle32();
            uVar8 = readle32();
            pAVar13 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
            if (uVar8 != 0) {
              uVar32 = 0;
              do {
                AVar5 = (ALfloat)readle32();
                pAVar13[uVar32] = AVar5;
                uVar32 = uVar32 + 1;
              } while (uVar8 != uVar32);
            }
            if (io_failure == 0) {
              visit_listener_state_changed_floatv(guserdata,pAVar22,uVar3,uVar8,pAVar13);
            }
            break;
          case 10:
            uVar3 = readle32();
            uVar8 = readle32();
            uVar9 = readle32();
            if (io_failure == 0) {
              visit_source_state_changed_bool(guserdata,uVar3,uVar8,(ALboolean)uVar9);
            }
            break;
          case 0xb:
            uVar3 = readle32();
            uVar8 = readle32();
            uVar9 = readle32();
            if (io_failure == 0) {
              visit_source_state_changed_enum(guserdata,uVar3,uVar8,uVar9);
            }
            break;
          case 0xc:
            uVar3 = readle32();
            uVar8 = readle32();
            uVar9 = readle32();
            if (io_failure == 0) {
              visit_source_state_changed_int(guserdata,uVar3,uVar8,uVar9);
            }
            break;
          case 0xd:
            uVar3 = readle32();
            uVar8 = readle32();
            uVar9 = readle32();
            if (io_failure == 0) {
              visit_source_state_changed_uint(guserdata,uVar3,uVar8,uVar9);
            }
            break;
          case 0xe:
            uVar3 = readle32();
            uVar8 = readle32();
            AVar5 = (ALfloat)readle32();
            if (io_failure == 0) {
              visit_source_state_changed_float(guserdata,uVar3,uVar8,AVar5);
            }
            break;
          case 0xf:
            uVar3 = readle32();
            uVar8 = readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            AVar7 = (ALfloat)readle32();
            if (io_failure == 0) {
              visit_source_state_changed_float3(guserdata,uVar3,uVar8,AVar5,AVar6,AVar7);
            }
            break;
          case 0x10:
            uVar3 = readle32();
            uVar8 = readle32();
            uVar9 = readle32();
            if (io_failure == 0) {
              visit_buffer_state_changed_int(guserdata,uVar3,uVar8,uVar9);
            }
            break;
          case 0x11:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (pAVar22 = (ALCcontext *)readle64(), io_failure == 0)) {
              visit_alcGetCurrentContext(&callerinfo,pAVar22);
            }
            break;
          case 0x12:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar22 = (ALCcontext *)readle64();
              pAVar20 = (ALCdevice *)readle64();
              if (io_failure == 0) {
                visit_alcGetContextsDevice(&callerinfo,pAVar20,pAVar22);
              }
            }
            break;
          case 0x13:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              puVar23 = IO_BLOB(&len);
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alcIsExtensionPresent
                          (&callerinfo,(ALCboolean)uVar3,pAVar20,(ALCchar *)puVar23);
              }
            }
            break;
          case 0x14:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              puVar23 = IO_BLOB(&len);
              pvVar25 = (void *)readle64();
              if (io_failure == 0) {
                visit_alcGetProcAddress(&callerinfo,pvVar25,pAVar20,(ALCchar *)puVar23);
              }
            }
            break;
          case 0x15:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              puVar23 = IO_BLOB(&len);
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alcGetEnumValue(&callerinfo,uVar3,pAVar20,(ALCchar *)puVar23);
              }
            }
            break;
          case 0x16:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              uVar3 = readle32();
              puVar23 = IO_BLOB(&len);
              if (io_failure == 0) {
                visit_alcGetString(&callerinfo,(ALCchar *)puVar23,pAVar20,uVar3);
              }
            }
            break;
          case 0x17:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              puVar23 = IO_BLOB(&len);
              uVar9 = readle32();
              uVar11 = readle32();
              local_268 = (ALfloat *)readle64();
              pAVar20 = (ALCdevice *)readle64();
              uVar3 = 0;
              uVar8 = 0;
              if (pAVar20 == (ALCdevice *)0x0) {
                puVar19 = (uint8 *)0x0;
                puVar30 = (uint8 *)0x0;
              }
              else {
                uVar8 = readle32();
                uVar3 = readle32();
                puVar19 = IO_BLOB(&len);
                puVar30 = IO_BLOB(&len);
              }
              if (io_failure == 0) {
                visit_alcCaptureOpenDevice
                          (&callerinfo,pAVar20,(ALCchar *)puVar23,uVar9,uVar11,(ALCsizei)local_268,
                           uVar8,uVar3,(ALCchar *)puVar19,(ALCchar *)puVar30);
              }
            }
            break;
          case 0x18:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alcCaptureCloseDevice(&callerinfo,(ALCboolean)uVar3,pAVar20);
              }
LAB_0010deee:
              add_devicelabel_to_map(pAVar20,(char *)0x0);
            }
            break;
          case 0x19:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              puVar23 = IO_BLOB(&len);
              pAVar20 = (ALCdevice *)readle64();
              uVar8 = 0;
              uVar3 = 0;
              if (pAVar20 == (ALCdevice *)0x0) {
                puVar19 = (uint8 *)0x0;
                puVar30 = (uint8 *)0x0;
              }
              else {
                uVar3 = readle32();
                uVar8 = readle32();
                puVar19 = IO_BLOB(&len);
                puVar30 = IO_BLOB(&len);
              }
              if (io_failure == 0) {
                visit_alcOpenDevice(&callerinfo,pAVar20,(ALCchar *)puVar23,uVar3,uVar8,
                                    (ALCchar *)puVar19,(ALCchar *)puVar30);
              }
            }
            break;
          case 0x1a:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alcCloseDevice(&callerinfo,(ALCboolean)uVar3,pAVar20);
              }
              goto LAB_0010deee;
            }
            break;
          case 0x1b:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              pAVar26 = (ALCint *)readle64();
              uVar3 = readle32();
              if (uVar3 == 0) {
                pAVar27 = (ALCint *)0x0;
              }
              else {
                pAVar27 = (ALCint *)get_ioblob((ulong)uVar3 * 4);
                uVar32 = 0;
                do {
                  uVar8 = readle32();
                  pAVar27[uVar32] = uVar8;
                  uVar32 = uVar32 + 1;
                } while (uVar3 != uVar32);
              }
              pAVar22 = (ALCcontext *)readle64();
              if (io_failure == 0) {
                visit_alcCreateContext(&callerinfo,pAVar22,pAVar20,pAVar26,uVar3,pAVar27);
              }
            }
            break;
          case 0x1c:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar22 = (ALCcontext *)readle64();
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alcMakeContextCurrent(&callerinfo,(ALCboolean)uVar3,pAVar22);
              }
            }
            break;
          case 0x1d:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (pAVar22 = (ALCcontext *)readle64(), io_failure == 0)) {
              visit_alcProcessContext(&callerinfo,pAVar22);
            }
            break;
          case 0x1e:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (pAVar22 = (ALCcontext *)readle64(), io_failure == 0)) {
              visit_alcSuspendContext(&callerinfo,pAVar22);
            }
            break;
          case 0x1f:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar22 = (ALCcontext *)readle64();
              if (io_failure == 0) {
                visit_alcDestroyContext(&callerinfo,pAVar22);
              }
              add_contextlabel_to_map(pAVar22,(char *)0x0);
            }
            break;
          case 0x20:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alcGetError(&callerinfo,uVar3,pAVar20);
              }
            }
            break;
          case 0x21:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              uVar3 = readle32();
              uVar29 = readle64();
              pAVar26 = (ALCint *)readle64();
              local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar3);
              uVar31 = (uint)uVar29;
              if (pAVar26 == (ALCint *)0x0) {
                pAVar27 = (ALCint *)0x0;
              }
              else {
                pAVar27 = (ALCint *)get_ioblob((long)(int)uVar31 << 2);
              }
              if (0 < (int)uVar31 && pAVar26 != (ALCint *)0x0) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar27[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alcGetIntegerv
                          (&callerinfo,pAVar20,(int)local_268,uVar31,pAVar26,(int)local_268 == 0x313
                           ,pAVar27);
              }
            }
            break;
          case 0x22:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (pAVar20 = (ALCdevice *)readle64(), io_failure == 0)) {
              visit_alcCaptureStart(&callerinfo,pAVar20);
            }
            break;
          case 0x23:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (pAVar20 = (ALCdevice *)readle64(), io_failure == 0)) {
              visit_alcCaptureStop(&callerinfo,pAVar20);
            }
            break;
          case 0x24:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              origbuffer = (ALCvoid *)readle64();
              uVar29 = readle64();
              puVar23 = IO_BLOB(&len);
              if (io_failure == 0) {
                visit_alcCaptureSamples
                          (&callerinfo,pAVar20,origbuffer,puVar23,(ALCsizei)len,(ALCsizei)uVar29);
              }
            }
            break;
          case 0x25:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (AVar5 = (ALfloat)readle32(), io_failure == 0)) {
              visit_alDopplerFactor(&callerinfo,AVar5);
            }
            break;
          case 0x26:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (AVar5 = (ALfloat)readle32(), io_failure == 0)) {
              visit_alDopplerVelocity(&callerinfo,AVar5);
            }
            break;
          case 0x27:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (AVar5 = (ALfloat)readle32(), io_failure == 0)) {
              visit_alSpeedOfSound(&callerinfo,AVar5);
            }
            break;
          case 0x28:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alDistanceModel(&callerinfo,uVar3);
            }
            break;
          case 0x29:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alEnable(&callerinfo,uVar3);
            }
            break;
          case 0x2a:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alDisable(&callerinfo,uVar3);
            }
            break;
          case 0x2b:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alIsEnabled(&callerinfo,(ALboolean)uVar8,uVar3);
              }
            }
            break;
          case 0x2c:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              puVar23 = IO_BLOB(&len);
              if (io_failure == 0) {
                visit_alGetString(&callerinfo,(ALchar *)puVar23,uVar3);
              }
            }
            break;
          case 0x2d:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              origvalues = (ALboolean *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                values = (ALboolean *)0x0;
              }
              else {
                values = (ALboolean *)get_ioblob((ulong)uVar8);
                uVar32 = 0;
                do {
                  uVar9 = readle32();
                  values[uVar32] = (ALboolean)uVar9;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetBooleanv(&callerinfo,uVar3,origvalues,uVar8,values);
              }
            }
            break;
          case 0x2e:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                pAVar18 = (ALint *)0x0;
              }
              else {
                pAVar18 = (ALint *)get_ioblob((ulong)uVar8 * 4);
                uVar32 = 0;
                do {
                  uVar9 = readle32();
                  pAVar18[uVar32] = uVar9;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetIntegerv(&callerinfo,uVar3,pAVar17,uVar8,uVar3 == 0xd000,pAVar18);
              }
            }
            break;
          case 0x2f:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                pAVar14 = (ALfloat *)0x0;
              }
              else {
                pAVar14 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
                uVar32 = 0;
                do {
                  AVar5 = (ALfloat)readle32();
                  pAVar14[uVar32] = AVar5;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetFloatv(&callerinfo,uVar3,pAVar13,uVar8,pAVar14);
              }
            }
            break;
          case 0x30:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              origvalues_00 = (ALdouble *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                values_00 = (ALdouble *)0x0;
              }
              else {
                values_00 = (ALdouble *)get_ioblob((ulong)uVar8 * 8);
                uVar32 = 0;
                do {
                  AVar28 = (ALdouble)readle64();
                  values_00[uVar32] = AVar28;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetDoublev(&callerinfo,uVar3,origvalues_00,uVar8,values_00);
              }
            }
            break;
          case 0x31:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alGetBoolean(&callerinfo,(ALboolean)uVar8,uVar3);
              }
            }
            break;
          case 0x32:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alGetInteger(&callerinfo,uVar8,uVar3);
              }
            }
            break;
          case 0x33:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetFloat(&callerinfo,AVar5,uVar3);
              }
            }
            break;
          case 0x34:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              AVar28 = (ALdouble)readle64();
              if (io_failure == 0) {
                visit_alGetDouble(&callerinfo,AVar28,uVar3);
              }
            }
            break;
          case 0x35:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              puVar23 = IO_BLOB(&len);
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alIsExtensionPresent(&callerinfo,(ALboolean)uVar3,(ALchar *)puVar23);
              }
            }
            break;
          case 0x36:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alGetError(&callerinfo,uVar3);
            }
            break;
          case 0x37:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              puVar23 = IO_BLOB(&len);
              pvVar25 = (void *)readle64();
              if (io_failure == 0) {
                visit_alGetProcAddress(&callerinfo,pvVar25,(ALchar *)puVar23);
              }
            }
            break;
          case 0x38:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              puVar23 = IO_BLOB(&len);
              uVar3 = readle32();
              if (io_failure == 0) {
                visit_alGetEnumValue(&callerinfo,uVar3,(ALchar *)puVar23);
              }
            }
            break;
          case 0x39:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                pAVar14 = (ALfloat *)0x0;
              }
              else {
                pAVar14 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
                uVar32 = 0;
                do {
                  AVar5 = (ALfloat)readle32();
                  pAVar14[uVar32] = AVar5;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alListenerfv(&callerinfo,uVar3,pAVar13,uVar8,pAVar14);
              }
            }
            break;
          case 0x3a:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alListenerf(&callerinfo,uVar3,AVar5);
              }
            }
            break;
          case 0x3b:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              AVar5 = (ALfloat)readle32();
              AVar6 = (ALfloat)readle32();
              AVar7 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alListener3f(&callerinfo,uVar3,AVar5,AVar6,AVar7);
              }
            }
            break;
          case 0x3c:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                pAVar18 = (ALint *)0x0;
              }
              else {
                pAVar18 = (ALint *)get_ioblob((ulong)uVar8 * 4);
                uVar32 = 0;
                do {
                  uVar9 = readle32();
                  pAVar18[uVar32] = uVar9;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alListeneriv(&callerinfo,uVar3,pAVar17,uVar8,pAVar18);
              }
            }
            break;
          case 0x3d:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alListeneri(&callerinfo,uVar3,uVar8);
              }
            }
            break;
          case 0x3e:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              uVar11 = readle32();
              if (io_failure == 0) {
                visit_alListener3i(&callerinfo,uVar3,uVar8,uVar9,uVar11);
              }
            }
            break;
          case 0x3f:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                pAVar14 = (ALfloat *)0x0;
              }
              else {
                pAVar14 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
                uVar32 = 0;
                do {
                  AVar5 = (ALfloat)readle32();
                  pAVar14[uVar32] = AVar5;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetListenerfv(&callerinfo,uVar3,pAVar13,uVar8,pAVar14);
              }
            }
            break;
          case 0x40:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar13 = (ALfloat *)readle64();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetListenerf(&callerinfo,uVar3,pAVar13,AVar5);
              }
            }
            break;
          case 0x41:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar13 = (ALfloat *)readle64();
              pAVar14 = (ALfloat *)readle64();
              origvalue3 = (ALfloat *)readle64();
              AVar5 = (ALfloat)readle32();
              AVar6 = (ALfloat)readle32();
              AVar7 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetListener3f
                          (&callerinfo,uVar3,pAVar13,pAVar14,origvalue3,AVar5,AVar6,AVar7);
              }
            }
            break;
          case 0x42:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alGetListeneri(&callerinfo,uVar3,pAVar17,uVar8);
              }
            }
            break;
          case 0x43:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar8 = readle32();
              if (uVar8 == 0) {
                pAVar18 = (ALint *)0x0;
              }
              else {
                pAVar18 = (ALint *)get_ioblob((ulong)uVar8 * 4);
                uVar32 = 0;
                do {
                  uVar9 = readle32();
                  pAVar18[uVar32] = uVar9;
                  uVar32 = uVar32 + 1;
                } while (uVar8 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetListeneriv(&callerinfo,uVar3,pAVar17,uVar8,pAVar18);
              }
            }
            break;
          case 0x44:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              pAVar17 = (ALint *)readle64();
              pAVar18 = (ALint *)readle64();
              pAVar21 = (ALint *)readle64();
              uVar8 = readle32();
              uVar9 = readle32();
              uVar11 = readle32();
              if (io_failure == 0) {
                visit_alGetListener3i(&callerinfo,uVar3,pAVar17,pAVar18,pAVar21,uVar8,uVar9,uVar11);
              }
            }
            break;
          case 0x45:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alGenSources(&callerinfo,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x46:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alDeleteSources(&callerinfo,uVar31,pAVar15,pAVar16);
              }
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  add_sourcelabel_to_map(pAVar16[uVar32],(char *)0x0);
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
            }
            break;
          case 0x47:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alIsSource(&callerinfo,(ALboolean)uVar8,uVar3);
              }
            }
            break;
          case 0x48:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar9 = readle32();
              pAVar14 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
              if (uVar9 != 0) {
                uVar32 = 0;
                do {
                  AVar5 = (ALfloat)readle32();
                  pAVar14[uVar32] = AVar5;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourcefv(&callerinfo,uVar3,uVar8,pAVar13,uVar9,pAVar14);
              }
            }
            break;
          case 0x49:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alSourcef(&callerinfo,uVar3,uVar8,AVar5);
              }
            }
            break;
          case 0x4a:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              AVar5 = (ALfloat)readle32();
              AVar6 = (ALfloat)readle32();
              AVar7 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alSource3f(&callerinfo,uVar3,uVar8,AVar5,AVar6,AVar7);
              }
            }
            break;
          case 0x4b:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar9 = readle32();
              pAVar18 = (ALint *)get_ioblob((ulong)uVar9 * 4);
              if (uVar9 != 0) {
                uVar32 = 0;
                do {
                  uVar11 = readle32();
                  pAVar18[uVar32] = uVar11;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourceiv(&callerinfo,uVar3,uVar8,pAVar17,uVar9,pAVar18);
              }
            }
            break;
          case 0x4c:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == 0) {
                visit_alSourcei(&callerinfo,uVar3,uVar8,uVar9);
              }
            }
            break;
          case 0x4d:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              uVar11 = readle32();
              uVar10 = readle32();
              if (io_failure == 0) {
                visit_alSource3i(&callerinfo,uVar3,uVar8,uVar9,uVar11,uVar10);
              }
            }
            break;
          case 0x4e:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar9 = readle32();
              if (uVar9 == 0) {
                pAVar14 = (ALfloat *)0x0;
              }
              else {
                pAVar14 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
                uVar32 = 0;
                do {
                  AVar5 = (ALfloat)readle32();
                  pAVar14[uVar32] = AVar5;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetSourcefv(&callerinfo,uVar3,uVar8,pAVar13,uVar9,pAVar14);
              }
            }
            break;
          case 0x4f:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetSourcef(&callerinfo,uVar3,uVar8,pAVar13,AVar5);
              }
            }
            break;
          case 0x50:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              local_268 = (ALfloat *)readle64();
              pAVar14 = (ALfloat *)readle64();
              AVar5 = (ALfloat)readle32();
              AVar6 = (ALfloat)readle32();
              AVar7 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetSource3f(&callerinfo,uVar3,uVar8,pAVar13,local_268,pAVar14,AVar5,AVar6,
                                    AVar7);
              }
            }
            break;
          case 0x51:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar9 = readle32();
              if (uVar9 == 0) {
                pAVar18 = (ALint *)0x0;
              }
              else {
                pAVar18 = (ALint *)get_ioblob((ulong)uVar9 * 4);
                uVar32 = 0;
                do {
                  uVar11 = readle32();
                  pAVar18[uVar32] = uVar11;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetSourceiv(&callerinfo,uVar3,uVar8,uVar8 == 0x1010,pAVar17,uVar9,pAVar18);
              }
            }
            break;
          case 0x52:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar9 = readle32();
              if (io_failure == 0) {
                visit_alGetSourcei(&callerinfo,uVar3,uVar8,uVar8 == 0x1010,pAVar17,uVar9);
              }
            }
            break;
          case 0x53:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              pAVar18 = (ALint *)readle64();
              pAVar21 = (ALint *)readle64();
              uVar9 = readle32();
              local_268 = (ALfloat *)CONCAT44(extraout_var_00,uVar9);
              uVar9 = readle32();
              uVar11 = readle32();
              if (io_failure == 0) {
                visit_alGetSource3i(&callerinfo,uVar3,uVar8,pAVar17,pAVar18,pAVar21,(ALint)local_268
                                    ,uVar9,uVar11);
              }
            }
            break;
          case 0x54:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alSourcePlay(&callerinfo,uVar3);
            }
            break;
          case 0x55:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourcePlayv(&callerinfo,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x56:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alSourcePause(&callerinfo,uVar3);
            }
            break;
          case 0x57:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourcePausev(&callerinfo,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x58:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alSourceRewind(&callerinfo,uVar3);
            }
            break;
          case 0x59:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourceRewindv(&callerinfo,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x5a:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (uVar3 = readle32(), io_failure == 0)) {
              visit_alSourceStop(&callerinfo,uVar3);
            }
            break;
          case 0x5b:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourceStopv(&callerinfo,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x5c:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar8 = readle32();
                  pAVar16[uVar32] = uVar8;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourceQueueBuffers(&callerinfo,uVar3,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x5d:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar8 = readle32();
                  pAVar16[uVar32] = uVar8;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alSourceUnqueueBuffers(&callerinfo,uVar3,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x5e:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alGenBuffers(&callerinfo,uVar31,pAVar15,pAVar16);
              }
            }
            break;
          case 0x5f:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar29 = readle64();
              pAVar15 = (ALuint *)readle64();
              uVar31 = (uint)uVar29;
              pAVar16 = (ALuint *)get_ioblob((long)(int)uVar31 * 4);
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  uVar3 = readle32();
                  pAVar16[uVar32] = uVar3;
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
              if (io_failure == 0) {
                visit_alDeleteBuffers(&callerinfo,uVar31,pAVar15,pAVar16);
              }
              if (0 < (int)uVar31) {
                uVar32 = 0;
                do {
                  add_bufferlabel_to_map(pAVar16[uVar32],(char *)0x0);
                  uVar32 = uVar32 + 1;
                } while ((uVar31 & 0x7fffffff) != uVar32);
              }
            }
            break;
          case 0x60:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              if (io_failure == 0) {
                visit_alIsBuffer(&callerinfo,(ALboolean)uVar8,uVar3);
              }
            }
            break;
          case 0x61:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              len = 0;
              uVar3 = readle32();
              uVar8 = readle32();
              uVar29 = readle64();
              origdata = (ALvoid *)readle64();
              puVar23 = IO_BLOB(&len);
              if (io_failure == 0) {
                visit_alBufferData(&callerinfo,uVar3,uVar8,origdata,puVar23,(ALCsizei)len,
                                   (ALsizei)uVar29);
              }
            }
            break;
          case 0x62:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar9 = readle32();
              pAVar14 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
              if (uVar9 != 0) {
                uVar32 = 0;
                do {
                  uVar11 = readle32();
                  pAVar14[uVar32] = (float)(int)uVar11;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alBufferfv(&callerinfo,uVar3,uVar8,pAVar13,uVar9,pAVar14);
              }
            }
            break;
          case 99:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alBufferf(&callerinfo,uVar3,uVar8,AVar5);
              }
            }
            break;
          case 100:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              AVar5 = (ALfloat)readle32();
              AVar6 = (ALfloat)readle32();
              AVar7 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alBuffer3f(&callerinfo,uVar3,uVar8,AVar5,AVar6,AVar7);
              }
            }
            break;
          case 0x65:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar9 = readle32();
              pAVar18 = (ALint *)get_ioblob((ulong)uVar9 * 4);
              if (uVar9 != 0) {
                uVar32 = 0;
                do {
                  uVar11 = readle32();
                  pAVar18[uVar32] = uVar11;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alBufferiv(&callerinfo,uVar3,uVar8,pAVar17,uVar9,pAVar18);
              }
            }
            break;
          case 0x66:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == 0) {
                visit_alBufferi(&callerinfo,uVar3,uVar8,uVar9);
              }
            }
            break;
          case 0x67:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              uVar11 = readle32();
              uVar10 = readle32();
              if (io_failure == 0) {
                visit_alBuffer3i(&callerinfo,uVar3,uVar8,uVar9,uVar11,uVar10);
              }
            }
            break;
          case 0x68:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              uVar9 = readle32();
              if (uVar9 == 0) {
                pAVar14 = (ALfloat *)0x0;
              }
              else {
                pAVar14 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
                uVar32 = 0;
                do {
                  AVar5 = (ALfloat)readle32();
                  pAVar14[uVar32] = AVar5;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetBufferfv(&callerinfo,uVar3,uVar8,pAVar13,uVar9,pAVar14);
              }
            }
            break;
          case 0x69:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              AVar5 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetBufferf(&callerinfo,uVar3,uVar8,pAVar13,AVar5);
              }
            }
            break;
          case 0x6a:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar13 = (ALfloat *)readle64();
              local_268 = (ALfloat *)readle64();
              pAVar14 = (ALfloat *)readle64();
              AVar5 = (ALfloat)readle32();
              AVar6 = (ALfloat)readle32();
              AVar7 = (ALfloat)readle32();
              if (io_failure == 0) {
                visit_alGetBuffer3f(&callerinfo,uVar3,uVar8,pAVar13,local_268,pAVar14,AVar5,AVar6,
                                    AVar7);
              }
            }
            break;
          case 0x6b:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar9 = readle32();
              if (io_failure == 0) {
                visit_alGetBufferi(&callerinfo,uVar3,uVar8,pAVar17,uVar9);
              }
            }
            break;
          case 0x6c:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              pAVar18 = (ALint *)readle64();
              pAVar21 = (ALint *)readle64();
              uVar9 = readle32();
              local_268 = (ALfloat *)CONCAT44(extraout_var,uVar9);
              uVar9 = readle32();
              uVar11 = readle32();
              if (io_failure == 0) {
                visit_alGetBuffer3i(&callerinfo,uVar3,uVar8,pAVar17,pAVar18,pAVar21,(ALint)local_268
                                    ,uVar9,uVar11);
              }
            }
            break;
          case 0x6d:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              uVar8 = readle32();
              pAVar17 = (ALint *)readle64();
              uVar9 = readle32();
              if (uVar9 == 0) {
                pAVar18 = (ALint *)0x0;
              }
              else {
                pAVar18 = (ALint *)get_ioblob((ulong)uVar9 * 4);
                uVar32 = 0;
                do {
                  uVar11 = readle32();
                  pAVar18[uVar32] = uVar11;
                  uVar32 = uVar32 + 1;
                } while (uVar9 != uVar32);
              }
              if (io_failure == 0) {
                visit_alGetBufferiv(&callerinfo,uVar3,uVar8,pAVar17,uVar9,pAVar18);
              }
            }
            break;
          case 0x6e:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              puVar23 = IO_BLOB(&len);
              if (io_failure == 0) {
                visit_alTracePushScope(&callerinfo,(ALchar *)puVar23);
              }
              trace_scope = trace_scope + 1;
            }
            break;
          case 0x6f:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              callerinfo.trace_scope = callerinfo.trace_scope - 1;
              trace_scope = trace_scope - 1;
              visit_alTracePopScope(&callerinfo);
            }
            break;
          case 0x70:
            IO_ENTRYINFO(&callerinfo);
            if ((io_failure == 0) && (puVar23 = IO_BLOB(&len), io_failure == 0)) {
              visit_alTraceMessage(&callerinfo,(ALchar *)puVar23);
            }
            break;
          case 0x71:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              puVar23 = IO_BLOB(&len);
              if (uVar3 != 0) {
                if (puVar23 == (uint8 *)0x0) {
                  pcVar24 = (char *)0x0;
                }
                else {
                  pcVar24 = strdup((char *)puVar23);
                }
                if (puVar23 == (uint8 *)0x0 || pcVar24 != (char *)0x0) {
                  add_bufferlabel_to_map(uVar3,pcVar24);
                }
              }
              if (io_failure == 0) {
                visit_alTraceBufferLabel(&callerinfo,uVar3,(ALchar *)puVar23);
              }
            }
            break;
          case 0x72:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              uVar3 = readle32();
              puVar23 = IO_BLOB(&len);
              if (uVar3 != 0) {
                if (puVar23 == (uint8 *)0x0) {
                  pcVar24 = (char *)0x0;
                }
                else {
                  pcVar24 = strdup((char *)puVar23);
                }
                if (puVar23 == (uint8 *)0x0 || pcVar24 != (char *)0x0) {
                  add_sourcelabel_to_map(uVar3,pcVar24);
                }
              }
              if (io_failure == 0) {
                visit_alTraceSourceLabel(&callerinfo,uVar3,(ALchar *)puVar23);
              }
            }
            break;
          case 0x73:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar20 = (ALCdevice *)readle64();
              puVar23 = IO_BLOB(&len);
              if (pAVar20 != (ALCdevice *)0x0) {
                if (puVar23 == (uint8 *)0x0) {
                  pcVar24 = (char *)0x0;
                }
                else {
                  pcVar24 = strdup((char *)puVar23);
                }
                if (puVar23 == (uint8 *)0x0 || pcVar24 != (char *)0x0) {
                  add_devicelabel_to_map(pAVar20,pcVar24);
                }
              }
              if (io_failure == 0) {
                visit_alcTraceDeviceLabel(&callerinfo,pAVar20,(ALCchar *)puVar23);
              }
            }
            break;
          case 0x74:
            IO_ENTRYINFO(&callerinfo);
            if (io_failure == 0) {
              pAVar22 = (ALCcontext *)readle64();
              puVar23 = IO_BLOB(&len);
              if (pAVar22 != (ALCcontext *)0x0) {
                if (puVar23 == (uint8 *)0x0) {
                  pcVar24 = (char *)0x0;
                }
                else {
                  pcVar24 = strdup((char *)puVar23);
                }
                if (puVar23 == (uint8 *)0x0 || pcVar24 != (char *)0x0) {
                  add_contextlabel_to_map(pAVar22,pcVar24);
                }
              }
              if (io_failure == 0) {
                visit_alcTraceContextLabel(&callerinfo,pAVar22,(ALCchar *)puVar23);
              }
            }
          }
        } while (!bVar1);
        iVar4 = local_26c;
        if (io_failure == 1) {
          visit_eos(guserdata,'\0',0);
          iVar4 = local_26c;
        }
        goto LAB_0010ff60;
      }
      process_tracelog_cold_2();
    }
    else {
      process_tracelog_cold_1();
    }
    iVar4 = 0;
  }
LAB_0010ff60:
  quit_altrace_playback();
  return iVar4;
}

Assistant:

int process_tracelog(const char *fname, void *userdata)
{
    int retval = 1;
    int eos = 0;
    off_t fdoffset = 0;
    off_t fdsize = 0;

    if (!init_altrace_playback(fname, userdata)) {
        return 0;
    }

    fdoffset = lseek(logfd, 0, SEEK_CUR);
    fdsize = lseek(logfd, 0, SEEK_END);
    if ((lseek(logfd, fdoffset, SEEK_SET) == -1) || (fdoffset == -1) || (fdsize == -1)) {
        fprintf(stderr, "%s: Failed to seek in file: %s\n", GAppName, strerror(errno));
        io_failure = 1;
    }

    while (!eos) {
        if (!io_failure) {
            fdoffset = lseek(logfd, 0, SEEK_CUR);
            if (fdoffset == -1) {
                fprintf(stderr, "%s: Failed to get current file offset: %s\n", GAppName, strerror(errno));
                io_failure = 1;
            }
        }

        if (io_failure) {
            retval = 0;
            eos = 1;
            break;
        }

        if (!visit_progress(guserdata, fdoffset, fdsize)) {
            fprintf(stderr, "%s: Application cancelled file processing!\n", GAppName);
            visit_eos(guserdata, AL_FALSE, 0);
            retval = -1;
            eos = 1;
            break;
        }

        switch (IO_EVENTENUM()) {
            #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) case ALEE_##name: decode_##name(); break;
            #include "altrace_entrypoints.h"

            case ALEE_NEW_CALLSTACK_SYMS:
                decode_callstack_syms_event();
                break;

            case ALEE_ALERROR_TRIGGERED:
                decode_al_error_event();
                break;

            case ALEE_ALCERROR_TRIGGERED:
                decode_alc_error_event();
                break;

            case ALEE_DEVICE_STATE_CHANGED_INT:
                decode_device_state_changed_int();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_ENUM:
                decode_context_state_changed_enum();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_FLOAT:
                decode_context_state_changed_float();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_STRING:
                decode_context_state_changed_string();
                break;

            case ALEE_LISTENER_STATE_CHANGED_FLOATV:
                decode_listener_state_changed_floatv();
                break;

            case ALEE_SOURCE_STATE_CHANGED_BOOL:
                decode_source_state_changed_bool();
                break;

            case ALEE_SOURCE_STATE_CHANGED_ENUM:
                decode_source_state_changed_enum();
                break;

            case ALEE_SOURCE_STATE_CHANGED_INT:
                decode_source_state_changed_int();
                break;

            case ALEE_SOURCE_STATE_CHANGED_UINT:
                decode_source_state_changed_uint();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT:
                decode_source_state_changed_float();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT3:
                decode_source_state_changed_float3();
                break;

            case ALEE_BUFFER_STATE_CHANGED_INT:
                decode_buffer_state_changed_int();
                break;

            case ALEE_EOS:
                decode_eos();
                eos = 1;
                break;

            default:
                if (!io_failure) {
                    visit_eos(guserdata, AL_FALSE, 0);
                }
                retval = 0;
                eos = 1;
                break;
        }
    }

    if (io_failure) {
        visit_eos(guserdata, AL_FALSE, 0);
    }

    quit_altrace_playback();

    return retval;
}